

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_AddClause(sat_solver *pSat,int *pBeg,int *pEnd)

{
  uint *pBeg_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  uint *puVar10;
  
  if (pEnd <= pBeg) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x6ca,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  if (pSat->fPrintClause != 0) {
    puVar10 = (uint *)pBeg;
    if (pBeg < pEnd) {
      do {
        pcVar9 = "!";
        if ((*puVar10 & 1) == 0) {
          pcVar9 = "";
        }
        printf("%s%d ",pcVar9,(ulong)(uint)((int)*puVar10 >> 1));
        puVar10 = puVar10 + 1;
      } while (puVar10 < pEnd);
    }
    putchar(10);
  }
  if ((pSat->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (pSat->temp_clause).size = 0;
  if (pBeg < pEnd) {
    do {
      iVar2 = *pBeg;
      uVar7 = (pSat->temp_clause).cap;
      if ((pSat->temp_clause).size == uVar7) {
        iVar6 = (uVar7 >> 1) * 3;
        if ((int)uVar7 < 4) {
          iVar6 = uVar7 * 2;
        }
        piVar3 = (pSat->temp_clause).ptr;
        if (piVar3 == (int *)0x0) {
          piVar3 = (int *)malloc((long)iVar6 << 2);
        }
        else {
          piVar3 = (int *)realloc(piVar3,(long)iVar6 << 2);
        }
        (pSat->temp_clause).ptr = piVar3;
        if (piVar3 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(pSat->temp_clause).cap * 9.5367431640625e-07,
                 (double)iVar6 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (pSat->temp_clause).cap = iVar6;
      }
      iVar6 = (pSat->temp_clause).size;
      (pSat->temp_clause).size = iVar6 + 1;
      (pSat->temp_clause).ptr[iVar6] = iVar2;
      pBeg = pBeg + 1;
    } while (pBeg < pEnd);
  }
  pBeg_00 = (uint *)(pSat->temp_clause).ptr;
  iVar2 = (pSat->temp_clause).size;
  iVar6 = (int)*pBeg_00 >> 1;
  puVar10 = pBeg_00 + iVar2;
  if (1 < (long)iVar2) {
    puVar4 = pBeg_00 + 1;
    do {
      uVar7 = *puVar4;
      puVar5 = puVar4;
      iVar1 = (int)uVar7 >> 1;
      if ((int)uVar7 >> 1 <= iVar6) {
        iVar1 = iVar6;
      }
      for (; (iVar6 = iVar1, pBeg_00 < puVar5 && ((int)uVar7 < (int)puVar5[-1]));
          puVar5 = puVar5 + -1) {
        *puVar5 = puVar5[-1];
        iVar1 = iVar6;
      }
      *puVar5 = uVar7;
      puVar4 = puVar4 + 1;
    } while (puVar4 < puVar10);
  }
  sat_solver_setnvars(pSat,iVar6 + 1);
  if (((Sto_Man_t *)pSat->pStore != (Sto_Man_t *)0x0) &&
     (iVar6 = Sto_ManAddClause((Sto_Man_t *)pSat->pStore,(lit *)pBeg_00,(lit *)puVar10), iVar6 == 0)
     ) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x6e8,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  puVar4 = pBeg_00;
  if (0 < iVar2) {
    uVar7 = 0xfffffffe;
    puVar5 = pBeg_00;
    do {
      uVar8 = *puVar5;
      if ((uVar8 ^ uVar7) == 1) {
        return 1;
      }
      if ((uVar8 & 1) == (int)pSat->assigns[(int)uVar8 >> 1]) {
        return 1;
      }
      if (pSat->assigns[(int)uVar8 >> 1] == '\x03' && uVar8 != uVar7) {
        *puVar4 = uVar8;
        puVar4 = puVar4 + 1;
        uVar7 = uVar8;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 < puVar10);
  }
  if (puVar4 == pBeg_00) {
    iVar2 = 0;
  }
  else {
    if ((long)puVar4 - (long)pBeg_00 == 4) {
      uVar7 = *pBeg_00;
      iVar2 = (int)uVar7 >> 1;
      if (pSat->pFreqs[iVar2] == '\0') {
        pSat->pFreqs[iVar2] = '\x01';
      }
      uVar8 = (uint)pSat->assigns[iVar2];
      if (uVar8 != 3) {
        return (uint)((uVar7 & 1) == uVar8);
      }
      pSat->assigns[iVar2] = (byte)uVar7 & 1;
      pSat->levels[iVar2] = (pSat->trail_lim).size;
      pSat->reasons[iVar2] = 0;
      iVar2 = pSat->qtail;
      pSat->qtail = iVar2 + 1;
      pSat->trail[iVar2] = uVar7;
    }
    else {
      sat_solver_clause_new(pSat,(lit *)pBeg_00,(lit *)puVar4,0);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Ifn_AddClause( sat_solver * pSat, int * pBeg, int * pEnd )
{
    int fVerbose = 0;
    int RetValue = sat_solver_addclause( pSat, pBeg, pEnd );
    if ( fVerbose )
    {
        for ( ; pBeg < pEnd; pBeg++ )
            printf( "%c%d ", Abc_LitIsCompl(*pBeg) ? '-':'+', Abc_Lit2Var(*pBeg) );
        printf( "\n" );
    }
    return RetValue;
}